

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
bench::show_to_console
          (bench *this,vector<bench::element,_std::allocator<bench::element>_> *current,string *name
          )

{
  double dVar1;
  pointer peVar2;
  ulong uVar3;
  pointer psVar4;
  pointer pmVar5;
  pointer pdVar6;
  undefined7 uVar7;
  undefined3 uVar8;
  int iVar9;
  long lVar10;
  __normal_iterator<const_bench::model_*,_std::vector<bench::model,_std::allocator<bench::model>_>_>
  _Var11;
  long lVar12;
  double *args;
  size_t j;
  size_type sVar13;
  size_t i;
  long lVar14;
  vector<bench::element,_std::allocator<bench::element>_> *pvVar15;
  long lVar16;
  size_type __n;
  long lVar17;
  long lVar18;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [64];
  int current_row_length;
  text_style local_a8;
  vector<bench::element,_std::allocator<bench::element>_> *local_90;
  string *local_88;
  long local_80;
  long local_78;
  vector<int,_std::allocator<int>_> row_length;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  unsigned_long modelname_lenght_max;
  
  lVar10 = ((long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x28;
  local_a8.foreground_color._0_4_ = 5;
  __n = (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
              _M_impl.super__Vector_impl_data._M_start >> 5;
  local_90 = current;
  local_88 = name;
  local_78 = lVar10;
  std::vector<int,_std::allocator<int>_>::vector
            (&row_length,__n,(value_type_conflict3 *)&local_a8,(allocator_type *)&local_48);
  current_row_length = 10;
  lVar18 = 0;
  for (lVar14 = 0; pvVar15 = local_90, lVar14 != local_78; lVar14 = lVar14 + 1) {
    for (sVar13 = 0; __n != sVar13; sVar13 = sVar13 + 1) {
      dVar23 = *(double *)
                ((long)(this->array).m_data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                sVar13 * 8 + (this->array).m_line_size * lVar18);
      if (ABS(dVar23) != INFINITY) {
        iVar9 = get_digits_number(dVar23);
        if (row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[sVar13] < iVar9) {
          row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar13] = iVar9;
        }
      }
    }
    lVar18 = lVar18 + 8;
  }
  lVar14 = 8;
  while (bVar19 = lVar10 != 0, lVar10 = lVar10 + -1, bVar19) {
    peVar2 = (pvVar15->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(char *)((long)&peVar2->solution + lVar14) == '\x01') {
      dVar23 = *(double *)((long)peVar2 + lVar14 + -8);
      if (ABS(dVar23) != INFINITY) {
        iVar9 = get_digits_number(dVar23);
        if (current_row_length < iVar9) {
          current_row_length = iVar9;
        }
      }
    }
    lVar14 = lVar14 + 0x10;
  }
  _Var11 = std::
           __max_element<__gnu_cxx::__normal_iterator<bench::model_const*,std::vector<bench::model,std::allocator<bench::model>>>,__gnu_cxx::__ops::_Iter_comp_iter<bench::show_to_console(std::vector<bench::element,std::allocator<bench::element>>const&,std::__cxx11::string)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                     ((this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  uVar3 = ((_Var11._M_current)->m_name)._M_string_length;
  modelname_lenght_max = 4;
  if (4 < uVar3) {
    modelname_lenght_max = uVar3;
  }
  ::fmt::v7::print<char[10],char_const(&)[5],unsigned_long&,char>
            ((char (*) [10])"{:^{}} | ",(char (*) [5])0x5557c8,&modelname_lenght_max);
  lVar10 = 0;
  while (bVar19 = __n != 0, __n = __n - 1, bVar19) {
    psVar4 = (this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_48._M_str = (&(psVar4->m_name)._M_dataplus)[lVar10]._M_p;
    local_48._M_len = (&(psVar4->m_name)._M_string_length)[lVar10];
    local_a8._0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_48,0,10);
    ::fmt::v7::print<char[8],std::basic_string_view<char,std::char_traits<char>>,int&,char>
              ((char (*) [8])"{:>{}} ",(basic_string_view<char,_std::char_traits<char>_> *)&local_a8
               ,(int *)((long)row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar10));
    lVar10 = lVar10 + 4;
  }
  ::fmt::v7::print<char[8],std::__cxx11::string&,int&,char>
            ((char (*) [8])"{:>{}}\n",local_88,&current_row_length);
  lVar14 = 0;
  lVar10 = 0;
  pvVar15 = local_90;
  do {
    if (lVar10 == local_78) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&row_length.super__Vector_base<int,_std::allocator<int>_>);
      return;
    }
    pmVar5 = (this->models).super__Vector_base<bench::model,_std::allocator<bench::model>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8.background_color = (color_type)pmVar5[lVar10].m_name._M_dataplus._M_p;
    local_a8.foreground_color = (color_type)pmVar5[lVar10].m_name._M_string_length;
    ::fmt::v7::
    print<char[10],std::basic_string_view<char,std::char_traits<char>>,unsigned_long&,char>
              ((char (*) [10])"{:^{}} | ",
               (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,&modelname_lenght_max);
    auVar24 = ZEXT1664(ZEXT816(0x7fefffffffffffff));
    dVar23 = -1.79769313486232e+308;
    lVar17 = (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->solvers).super__Vector_base<bench::solver,_std::allocator<bench::solver>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    for (lVar18 = 0; lVar17 != lVar18; lVar18 = lVar18 + 1) {
      dVar20 = *(double *)
                ((long)(this->array).m_data.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                lVar18 * 8 + (this->array).m_line_size * lVar14);
      if (ABS(dVar20) == INFINITY) {
LAB_00122dda:
        dVar20 = dVar23;
      }
      else {
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar20;
        auVar22 = vminsd_avx(auVar21,auVar24._0_16_);
        auVar24 = ZEXT1664(auVar22);
        if (dVar20 <= dVar23) goto LAB_00122dda;
      }
      dVar23 = dVar20;
    }
    peVar2 = (pvVar15->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((peVar2[lVar10].success == false) ||
       (dVar20 = peVar2[lVar10].solution, ABS(dVar20) == INFINITY)) {
LAB_00122e2d:
      dVar20 = dVar23;
    }
    else {
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar20;
      auVar22 = vminsd_avx(auVar22,auVar24._0_16_);
      auVar24 = ZEXT1664(auVar22);
      if (dVar20 <= dVar23) goto LAB_00122e2d;
    }
    lVar16 = 0;
    lVar18 = 0;
    local_88 = auVar24._0_8_;
    local_80 = lVar10;
    while( true ) {
      lVar12 = local_80;
      pvVar15 = local_90;
      bVar19 = lVar17 == 0;
      lVar17 = lVar17 + -1;
      dVar23 = auVar24._0_8_;
      uVar7 = local_a8.background_color._1_7_;
      uVar8 = local_a8.background_color.value.rgb_color._1_3_;
      if (bVar19) break;
      lVar12 = (this->array).m_line_size * lVar14;
      pdVar6 = (this->array).m_data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar1 = *(double *)((long)pdVar6 + lVar16 + lVar12);
      args = (double *)((long)pdVar6 + lVar16 + lVar12);
      if ((dVar1 != dVar23) || (NAN(dVar1) || NAN(dVar23))) {
        if ((dVar1 != dVar20) || (NAN(dVar1) || NAN(dVar20))) {
          ::fmt::v7::print<char[11],double&,int&,char>
                    ((char (*) [11])"{:>{}.3f} ",args,
                     (int *)((long)row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar18));
        }
        else {
          local_a8.background_color.is_rgb = false;
          local_a8._0_16_ = CONCAT79(uVar7,local_a8._0_9_);
          local_a8.background_color.value.term_color = 0;
          local_a8._0_16_ = CONCAT313(uVar8,local_a8._0_13_);
          local_a8.ems = 0;
          local_a8.foreground_color.is_rgb = true;
          local_a8.foreground_color._1_3_ = 0;
          local_a8.foreground_color.value = (color_union)0xff;
          local_a8.set_foreground_color = true;
          local_a8.set_background_color = false;
          ::fmt::v7::print<char[11],_double,_int,_0>
                    (&local_a8,(char (*) [11])"{:>{}.3f} ",args,
                     (int *)((long)row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start + lVar18));
        }
      }
      else {
        local_a8.background_color.is_rgb = false;
        local_a8._0_16_ = CONCAT79(uVar7,local_a8._0_9_);
        local_a8.background_color.value.term_color = 0;
        local_a8._0_16_ = CONCAT313(uVar8,local_a8._0_13_);
        local_a8.ems = 0;
        local_a8.foreground_color.is_rgb = true;
        local_a8.foreground_color._1_3_ = 0;
        local_a8.foreground_color.value = (color_union)0x8000;
        local_a8.set_foreground_color = true;
        local_a8.set_background_color = false;
        ::fmt::v7::print<char[11],_double,_int,_0>
                  (&local_a8,(char (*) [11])"{:>{}.3f} ",args,
                   (int *)((long)row_length.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar18));
      }
      auVar24 = ZEXT864(local_88);
      lVar18 = lVar18 + 4;
      lVar16 = lVar16 + 8;
    }
    peVar2 = (local_90->super__Vector_base<bench::element,_std::allocator<bench::element>_>)._M_impl
             .super__Vector_impl_data._M_start;
    dVar1 = peVar2[lVar10].solution;
    peVar2 = peVar2 + lVar10;
    if ((dVar1 != dVar23) || (NAN(dVar1) || NAN(dVar23))) {
      if ((dVar1 != dVar20) || (NAN(dVar1) || NAN(dVar20))) {
        ::fmt::v7::print<char[11],double_const&,int&,char>
                  ((char (*) [11])"{:>{}.3f} ",&peVar2->solution,&current_row_length);
      }
      else {
        local_a8.background_color.is_rgb = false;
        local_a8._0_16_ = CONCAT79(uVar7,local_a8._0_9_);
        local_a8.background_color.value.term_color = 0;
        local_a8._0_16_ = CONCAT313(uVar8,local_a8._0_13_);
        local_a8.ems = 0;
        local_a8.foreground_color.is_rgb = true;
        local_a8.foreground_color._1_3_ = 0;
        local_a8.foreground_color.value = (color_union)0xff;
        local_a8.set_foreground_color = true;
        local_a8.set_background_color = false;
        ::fmt::v7::print<char[11],_double,_int,_0>
                  (&local_a8,(char (*) [11])"{:>{}.3f} ",&peVar2->solution,&current_row_length);
      }
    }
    else {
      local_a8.background_color.is_rgb = false;
      local_a8._0_16_ = CONCAT79(uVar7,local_a8._0_9_);
      local_a8.background_color.value.term_color = 0;
      local_a8._0_16_ = CONCAT313(uVar8,local_a8._0_13_);
      local_a8.ems = 0;
      local_a8.foreground_color.is_rgb = true;
      local_a8.foreground_color._1_3_ = 0;
      local_a8.foreground_color.value = (color_union)0x8000;
      local_a8.set_foreground_color = true;
      local_a8.set_background_color = false;
      ::fmt::v7::print<char[11],_double,_int,_0>
                (&local_a8,(char (*) [11])"{:>{}.3f} ",&peVar2->solution,&current_row_length);
      lVar12 = local_80;
    }
    ::fmt::v7::print<char[2],,char>((char (*) [2])0x556927);
    lVar10 = lVar12 + 1;
    lVar14 = lVar14 + 8;
  } while( true );
}

Assistant:

void show_to_console(const std::vector<element>& current, std::string name)
    {
        const auto model_size{ models.size() };
        const auto solver_size{ solvers.size() };

        std::vector<int> row_length(solvers.size(), 5);
        int current_row_length = { 10 };

        for (size_t i{ 0 }; i != model_size; ++i) {
            for (size_t j{ 0 }; j != solver_size; ++j) {
                if (is_valid(array(i, j))) {
                    auto digits = get_digits_number(array(i, j));

                    if (digits > row_length[j])
                        row_length[j] = digits;
                }
            }
        }

        for (size_t i{ 0 }; i != model_size; ++i) {
            if (current[i].success && is_valid(current[i].solution)) {
                auto digits = get_digits_number(current[i].solution);

                if (digits > current_row_length)
                    current_row_length = digits;
            }
        }

        auto modelname_lenght_max =
          std::max(static_cast<std::string::size_type>(4),
                   std::max_element(models.cbegin(),
                                    models.cend(),
                                    [](const auto& lhs, const auto& rhs) {
                                        return lhs.size() < rhs.size();
                                    })
                     ->size());

        fmt::print("{:^{}} | ", "file", modelname_lenght_max);

        for (std::size_t solver{ 0 }; solver != solver_size; ++solver)
            fmt::print("{:>{}} ",
                       solvers[solver].name().substr(0, 10),
                       row_length[solver]);

        fmt::print("{:>{}}\n", name, current_row_length);

        for (size_t i{ 0 }; i != model_size; ++i) {
            fmt::print("{:^{}} | ", models[i].name(), modelname_lenght_max);

            auto lower = std::numeric_limits<double>::max();
            auto upper = std::numeric_limits<double>::lowest();

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {
                if (is_valid(array(i, solver)) && lower > array(i, solver))
                    lower = array(i, solver);

                if (is_valid(array(i, solver)) && upper < array(i, solver))
                    upper = array(i, solver);
            }

            if (current[i].success) {
                if (is_valid(current[i].solution) &&
                    lower > current[i].solution)
                    lower = current[i].solution;

                if (is_valid(current[i].solution) &&
                    upper < current[i].solution)
                    upper = current[i].solution;
            }

            for (std::size_t solver{ 0 }, end_solver(solvers.size());
                 solver != end_solver;
                 ++solver) {

                if (array(i, solver) == lower)
                    fmt::print(fg(fmt::color::green),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else if (array(i, solver) == upper)
                    fmt::print(fg(fmt::color::blue),
                               "{:>{}.3f} ",
                               array(i, solver),
                               row_length[solver]);
                else
                    fmt::print(
                      "{:>{}.3f} ", array(i, solver), row_length[solver]);
            }

            if (current[i].solution == lower)
                fmt::print(fg(fmt::color::green),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else if (current[i].solution == upper)
                fmt::print(fg(fmt::color::blue),
                           "{:>{}.3f} ",
                           current[i].solution,
                           current_row_length);
            else
                fmt::print(
                  "{:>{}.3f} ", current[i].solution, current_row_length);

            fmt::print("\n");
        }
    }